

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

RegOpnd * __thiscall Inline::GetCallbackFunctionOpnd(Inline *this,Instr *callInstr)

{
  Opnd *pOVar1;
  StackSym *pSVar2;
  Instr *pIVar3;
  PropertySymOpnd *this_00;
  RegOpnd *pRVar4;
  Instr *targetDefInstr;
  Instr *callApplyLdInstr;
  Instr *callInstr_local;
  Inline *this_local;
  
  pOVar1 = IR::Instr::GetSrc1(callInstr);
  pSVar2 = IR::Opnd::GetStackSym(pOVar1);
  pIVar3 = StackSym::GetInstrDef(pSVar2);
  pOVar1 = IR::Instr::GetSrc1(pIVar3);
  this_00 = IR::Opnd::AsPropertySymOpnd(pOVar1);
  pSVar2 = IR::PropertySymOpnd::GetObjectSym(this_00);
  pIVar3 = StackSym::GetInstrDef(pSVar2);
  pOVar1 = IR::Instr::GetDst(pIVar3);
  pRVar4 = IR::Opnd::AsRegOpnd(pOVar1);
  return pRVar4;
}

Assistant:

IR::RegOpnd * Inline::GetCallbackFunctionOpnd(IR::Instr * callInstr)
{
    IR::Instr * callApplyLdInstr = callInstr->GetSrc1()->GetStackSym()->GetInstrDef();
    IR::Instr * targetDefInstr = callApplyLdInstr->GetSrc1()->AsPropertySymOpnd()->GetObjectSym()->GetInstrDef();
    return targetDefInstr->GetDst()->AsRegOpnd();
}